

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *p)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < (long)p->nRows) {
    lVar1 = 0;
    do {
      iVar2 = 0;
      if (0 < p->nCols) {
        uVar3 = 0;
        iVar2 = 0;
        do {
          iVar2 = iVar2 + (uint)(p->pMatrix[uVar3][lVar1] == '\x01');
          uVar3 = uVar3 + 1;
        } while ((uint)p->nCols != uVar3);
      }
      if (iVar2 != p->pRowSums[lVar1]) {
        __assert_fail("Counter == p->pRowSums[iRow]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Matrix.c"
                      ,100,"void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *)");
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != p->nRows);
  }
  return;
}

Assistant:

void Llb_MtrVerifyColumnsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iRow = 0; iRow < p->nRows; iRow++ )
    {
        Counter = 0;
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pRowSums[iRow] );
    }
}